

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QPointer<QTextList>>::emplace<QPointer<QTextList>const&>
          (QMovableArrayOps<QPointer<QTextList>_> *this,qsizetype i,QPointer<QTextList> *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  undefined8 in_RDX;
  QArrayDataPointer<QPointer<QTextList>_> *in_RSI;
  QArrayDataPointer<QPointer<QTextList>_> *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QPointer<QTextList> tmp;
  QPointer<QTextList> *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  undefined1 uVar5;
  undefined2 in_stack_ffffffffffffffa4;
  byte bVar6;
  GrowthPosition where;
  Inserter local_40;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  where = (GrowthPosition)((ulong)in_RDX >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = QArrayDataPointer<QPointer<QTextList>_>::needsDetach
                    ((QArrayDataPointer<QPointer<QTextList>_> *)
                     CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  if (!(bool)uVar1) {
    if ((in_RSI == (QArrayDataPointer<QPointer<QTextList>_> *)in_RDI->size) &&
       (qVar3 = QArrayDataPointer<QPointer<QTextList>_>::freeSpaceAtEnd(in_RDI), qVar3 != 0)) {
      QArrayDataPointer<QPointer<QTextList>_>::end
                ((QArrayDataPointer<QPointer<QTextList>_> *)
                 CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
      QPointer<QTextList>::QPointer
                ((QPointer<QTextList> *)
                 CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff88);
      in_RDI->size = in_RDI->size + 1;
      goto LAB_00a01f46;
    }
    if ((in_RSI == (QArrayDataPointer<QPointer<QTextList>_> *)0x0) &&
       (qVar3 = QArrayDataPointer<QPointer<QTextList>_>::freeSpaceAtBegin(in_RDI), qVar3 != 0)) {
      QArrayDataPointer<QPointer<QTextList>_>::begin
                ((QArrayDataPointer<QPointer<QTextList>_> *)0xa01e14);
      QPointer<QTextList>::QPointer
                ((QPointer<QTextList> *)
                 CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff88);
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_00a01f46;
    }
  }
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QPointer<QTextList>::QPointer
            ((QPointer<QTextList> *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffff88);
  bVar4 = in_RDI->size != 0;
  uVar5 = bVar4 && in_RSI == (QArrayDataPointer<QPointer<QTextList>_> *)0x0;
  uVar2 = (uint)(bVar4 && in_RSI == (QArrayDataPointer<QPointer<QTextList>_> *)0x0);
  bVar6 = uVar5;
  QArrayDataPointer<QPointer<QTextList>_>::detachAndGrow
            (in_RSI,where,CONCAT17(uVar1,CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffffa4,uVar2))),
             (QPointer<QTextList> **)in_RDI,
             (QArrayDataPointer<QPointer<QTextList>_> *)CONCAT17(uVar5,in_stack_ffffffffffffff90));
  if ((bVar6 & 1) == 0) {
    QMovableArrayOps<QPointer<QTextList>_>::Inserter::Inserter
              ((Inserter *)CONCAT17(uVar1,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffffa4,uVar2)))
               ,in_RDI,CONCAT17(uVar5,in_stack_ffffffffffffff90),
               (qsizetype)in_stack_ffffffffffffff88);
    QMovableArrayOps<QPointer<QTextList>_>::Inserter::insertOne
              ((Inserter *)CONCAT17(uVar5,in_stack_ffffffffffffff90),in_stack_ffffffffffffff88);
    QMovableArrayOps<QPointer<QTextList>_>::Inserter::~Inserter(&local_40);
  }
  else {
    QArrayDataPointer<QPointer<QTextList>_>::begin
              ((QArrayDataPointer<QPointer<QTextList>_> *)0xa01eda);
    QPointer<QTextList>::QPointer
              ((QPointer<QTextList> *)CONCAT17(uVar5,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88);
    in_RDI->ptr = in_RDI->ptr + -1;
    in_RDI->size = in_RDI->size + 1;
  }
  QPointer<QTextList>::~QPointer((QPointer<QTextList> *)0xa01f46);
LAB_00a01f46:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }